

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O1

int getRewindTime(MidiFile *midifile,int track)

{
  int index;
  bool bVar1;
  int iVar2;
  int iVar3;
  MidiEventList *pMVar4;
  MidiEvent *pMVar5;
  
  iVar2 = smf::MidiFile::getEventCount(midifile,track);
  if (0 < iVar2) {
    iVar2 = iVar2 + 1;
    do {
      index = iVar2 + -2;
      pMVar4 = smf::MidiFile::operator[](midifile,track);
      pMVar5 = smf::MidiEventList::operator[](pMVar4,index);
      bVar1 = smf::MidiMessage::isNoteOn(&pMVar5->super_MidiMessage);
      if (bVar1) {
        pMVar4 = smf::MidiFile::operator[](midifile,track);
        pMVar5 = smf::MidiEventList::operator[](pMVar4,index);
        iVar3 = smf::MidiMessage::getKeyNumber(&pMVar5->super_MidiMessage);
        if (iVar3 == RewindKey) {
          pMVar4 = smf::MidiFile::operator[](midifile,track);
          pMVar5 = smf::MidiEventList::operator[](pMVar4,index);
          return pMVar5->tick;
        }
      }
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return -1;
}

Assistant:

int getRewindTime(MidiFile& midifile, int track) {
	int count = midifile.getEventCount(track);
	for (int i=count-1; i>=0; i--) {
		if (!midifile[track][i].isNoteOn()) {
			continue;
		}
		if (midifile[track][i].getKeyNumber() == RewindKey) {
			return midifile[track][i].tick;
		}
	}

	return -1;
}